

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mie.cpp
# Opt level: O0

void __thiscall
OpenMD::Mie::addExplicitInteraction
          (Mie *this,AtomType *atype1,AtomType *atype2,RealType sigma,RealType epsilon,int nRep,
          int mAtt)

{
  size_type sVar1;
  reference pvVar2;
  _Rb_tree_const_iterator<int> this_00;
  reference pvVar3;
  reference pvVar4;
  int in_ECX;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  value_type_conflict2 *__x;
  int in_R8D;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar7;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int mietid2;
  int mietid1;
  int atid2;
  int atid1;
  int nMie;
  RealType m;
  RealType n;
  MieInteractionData mixer;
  undefined4 in_stack_ffffffffffffff10;
  int iVar8;
  undefined4 in_stack_ffffffffffffff14;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_c0;
  _Base_ptr local_b0;
  undefined1 local_a8;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_a0;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_90;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  double local_38;
  AtomType *local_18;
  AtomType *local_10;
  
  local_48 = 1.0 / in_XMM0_Qa;
  dVar5 = (double)in_ECX;
  local_68 = (double)in_R8D;
  local_60 = dVar5;
  local_18 = in_RDX;
  local_10 = in_RSI;
  dVar6 = pow(dVar5 / local_68,local_68 / (dVar5 - local_68));
  local_38 = (dVar5 * dVar6) / (local_60 - local_68);
  __x = (value_type_conflict2 *)(in_RDI + 0x10);
  sVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3009fe);
  local_6c = (int)sVar1;
  local_70 = AtomType::getIdent(local_10);
  local_74 = AtomType::getIdent(local_18);
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)
             CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(in_stack_ffffffffffffff30,__x)
  ;
  local_b0 = (_Base_ptr)pVar7.first._M_node;
  local_a8 = pVar7.second;
  local_a0.first._M_node = local_b0;
  local_a0.second = (bool)local_a8;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_90,&local_a0);
  if ((local_90.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_70);
    local_78 = *pvVar2;
  }
  else {
    local_78 = local_6c;
    iVar8 = local_6c;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_70);
    *pvVar2 = iVar8;
    local_6c = local_6c + 1;
  }
  pVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(in_stack_ffffffffffffff30,__x)
  ;
  this_00 = pVar7.first._M_node;
  local_c0.second = pVar7.second;
  local_c0.first._M_node = this_00._M_node;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_90,&local_c0);
  if ((local_90.second & 1U) == 0) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_74);
    local_7c = *pvVar2;
  }
  else {
    local_7c = local_6c;
    iVar8 = local_6c;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_74);
    *pvVar2 = iVar8;
    local_6c = local_6c + 1;
  }
  std::
  vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
            *)this_00._M_node,(size_type)__x);
  std::
  vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                *)(in_RDI + 0x58),(long)local_78);
  std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::resize
            ((vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_> *)
             this_00._M_node,(size_type)__x);
  pvVar3 = std::
           vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                         *)(in_RDI + 0x58),(long)local_78);
  pvVar4 = std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::
           operator[](pvVar3,(long)local_7c);
  memcpy(pvVar4,local_58,0x28);
  if (local_7c != local_78) {
    std::
    vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                  *)(in_RDI + 0x58),(long)local_7c);
    std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::resize
              ((vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_> *)
               this_00._M_node,(size_type)__x);
    pvVar3 = std::
             vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>,_std::allocator<std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>_>_>
                           *)(in_RDI + 0x58),(long)local_7c);
    pvVar4 = std::vector<OpenMD::MieInteractionData,_std::allocator<OpenMD::MieInteractionData>_>::
             operator[](pvVar3,(long)local_78);
    memcpy(pvVar4,local_58,0x28);
  }
  return;
}

Assistant:

void Mie::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType sigma, RealType epsilon, int nRep,
                                   int mAtt) {
    MieInteractionData mixer;
    mixer.sigma   = sigma;
    mixer.epsilon = epsilon;
    mixer.sigmai  = 1.0 / mixer.sigma;
    mixer.nRep    = nRep;
    mixer.mAtt    = mAtt;

    RealType n = RealType(nRep);
    RealType m = RealType(mAtt);

    mixer.nmScale = n * pow(n / m, m / (n - m)) / (n - m);

    int nMie  = MieTypes.size();
    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();
    int mietid1, mietid2;

    pair<set<int>::iterator, bool> ret;
    ret = MieTypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      mietid1 = MieTids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      mietid1        = nMie;
      MieTids[atid1] = nMie;
      nMie++;
    }

    ret = MieTypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the MieMap, just get the mietid:
      mietid2 = MieTids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      mietid2        = nMie;
      MieTids[atid2] = nMie;
      nMie++;
    }

    MixingMap.resize(nMie);
    MixingMap[mietid1].resize(nMie);

    MixingMap[mietid1][mietid2] = mixer;
    if (mietid2 != mietid1) {
      MixingMap[mietid2].resize(nMie);
      MixingMap[mietid2][mietid1] = mixer;
    }
  }